

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvPendulum_dns.c
# Opt level: O0

int fref(sunrealtype t,N_Vector yy,N_Vector fy,void *f_data)

{
  double *pdVar1;
  double *pdVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double dVar3;
  sunrealtype *fydata;
  sunrealtype *yydata;
  
  pdVar1 = (double *)N_VGetArrayPointer(in_RDI);
  pdVar2 = (double *)N_VGetArrayPointer(in_RSI);
  *pdVar2 = pdVar1[1];
  dVar3 = cos(*pdVar1);
  pdVar2[1] = dVar3 * -13.750371636040745;
  return 0;
}

Assistant:

static int fref(sunrealtype t, N_Vector yy, N_Vector fy, void* f_data)
{
  sunrealtype* yydata = NULL; /* yy vector data */
  sunrealtype* fydata = NULL; /* fy vector data */

  /* Get vector array pointers */
  yydata = N_VGetArrayPointer(yy);
  fydata = N_VGetArrayPointer(fy);

  fydata[0] = yydata[1];              /* theta'          */
  fydata[1] = -GRAV * COS(yydata[0]); /* -g * cos(theta) */
  return (0);
}